

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O0

clockval_t * __thiscall
tchecker::clockval_allocate_and_construct
          (tchecker *this,unsigned_short size,clock_rational_value_t value)

{
  size_t sVar1;
  clockval_t *ptr_00;
  undefined6 in_register_00000032;
  char *ptr;
  undefined1 auStack_18 [6];
  unsigned_short size_local;
  clock_rational_value_t value_local;
  
  _auStack_18 = CONCAT62(in_register_00000032,size);
  value_local.num = value.num;
  ptr._6_2_ = SUB82(this,0);
  sVar1 = allocation_size_t<tchecker::clockval_t>::alloc_size<unsigned_short&>
                    ((unsigned_short *)((long)&ptr + 6));
  ptr_00 = (clockval_t *)operator_new__(sVar1);
  clockval_t::construct<unsigned_short&,boost::rational<long>&>
            (ptr_00,(unsigned_short *)((long)&ptr + 6),(rational<long> *)auStack_18);
  return ptr_00;
}

Assistant:

tchecker::clockval_t * clockval_allocate_and_construct(unsigned short size, tchecker::clock_rational_value_t value)
{
  char * ptr = new char[tchecker::allocation_size_t<tchecker::clockval_t>::alloc_size(size)];
  tchecker::clockval_t::construct(ptr, size, value);
  return reinterpret_cast<tchecker::clockval_t *>(ptr);
}